

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalNinjaGenerator::WriteCustomCommandBuildStatement
          (cmLocalNinjaGenerator *this,cmCustomCommand *cc,
          set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
          *targets,string *fileConfig)

{
  pointer *ppbVar1;
  cmGeneratorTarget *pcVar2;
  cmMakefile *this_00;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  PolicyStatus PVar7;
  reference this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  cmGlobalNinjaGenerator *pcVar9;
  reference ppcVar10;
  string *psVar11;
  size_type sVar12;
  iterator iVar13;
  iterator iVar14;
  iterator __first2;
  iterator __last2;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths;
  cmSourceFile *this_02;
  reference pvVar15;
  cmGeneratedFileStream *os;
  ulong uVar16;
  string *__rhs;
  cmake *this_03;
  cmListFileBacktrace *backtrace;
  PolicyID id;
  string_view input;
  byte local_76a;
  bool local_721;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_610;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5f8;
  CCOutputs local_5e0;
  string local_5a8;
  string local_588;
  cmAlphaNum local_568;
  cmAlphaNum local_538;
  undefined1 local_508 [8];
  string comment;
  string local_4c8;
  byte local_4a3;
  byte local_4a2;
  allocator<char> local_4a1;
  string local_4a0;
  undefined1 local_480 [8];
  string depfile;
  string local_450;
  string local_430 [32];
  undefined1 local_410 [8];
  cmCryptoHash hash;
  string customStep;
  cmAlphaNum local_3b0;
  string local_380;
  allocator<char> local_359;
  string local_358;
  undefined1 local_338 [8];
  cmNinjaBuild build;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmdLines;
  cmNinjaDeps ninjaDeps;
  string mainOutput;
  CCOutputs ccOutputs;
  string local_188;
  cmSourceFile *local_168;
  cmSourceFile *sf;
  string *output;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool symbolic;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  undefined1 local_e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depsIntersection;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  jDeps;
  _Self local_a0;
  _Self local_98;
  iterator j;
  cmNinjaDeps orderOnlyDeps;
  cmCustomCommandGenerator *ccg;
  iterator __end1;
  iterator __begin1;
  vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *__range1;
  vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> ccgs;
  cmGlobalNinjaGenerator *gg;
  string *fileConfig_local;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  *targets_local;
  cmCustomCommand *cc_local;
  cmLocalNinjaGenerator *this_local;
  
  ccgs.super__Vector_base<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)GetGlobalNinjaGenerator(this);
  bVar4 = cmGlobalNinjaGenerator::SeenCustomCommand
                    ((cmGlobalNinjaGenerator *)
                     ccgs.
                     super__Vector_base<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,cc,fileConfig);
  if (!bVar4) {
    (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xd])
              (&__range1,this,cc,fileConfig);
    __end1 = std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>::begin
                       ((vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                         *)&__range1);
    ccg = (cmCustomCommandGenerator *)
          std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>::end
                    ((vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *)
                     &__range1);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<cmCustomCommandGenerator_*,_std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>_>
                                       *)&ccg), bVar4) {
      this_01 = __gnu_cxx::
                __normal_iterator<cmCustomCommandGenerator_*,_std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>_>
                ::operator*(&__end1);
      pvVar8 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(this_01);
      bVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(pvVar8);
      if (bVar4) {
        pvVar8 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(this_01);
        bVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(pvVar8);
        if (!bVar4) goto LAB_004ed0c7;
      }
      else {
LAB_004ed0c7:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&j);
        local_98._M_node =
             (_Base_ptr)
             std::
             set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
             ::begin(targets);
        local_a0._M_node =
             (_Base_ptr)
             std::
             set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
             ::end(targets);
        bVar4 = std::operator!=(&local_98,&local_a0);
        if (!bVar4) {
          __assert_fail("j != targets.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLocalNinjaGenerator.cxx"
                        ,599,
                        "void cmLocalNinjaGenerator::WriteCustomCommandBuildStatement(const cmCustomCommand *, const std::set<cmGeneratorTarget *> &, const std::string &)"
                       );
        }
        pcVar9 = GetGlobalNinjaGenerator(this);
        ppcVar10 = std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator*(&local_98);
        pcVar2 = *ppcVar10;
        psVar11 = cmCustomCommandGenerator::GetOutputConfig_abi_cxx11_(this_01);
        sVar12 = std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>::
                 size((vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *
                      )&__range1);
        cmGlobalNinjaGenerator::AppendTargetDependsClosure
                  (pcVar9,pcVar2,(cmNinjaDeps *)&j,psVar11,fileConfig,1 < sVar12);
        iVar13 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&j);
        iVar14 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&j);
        std::
        sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )iVar13._M_current,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )iVar14._M_current);
        std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator++(&local_98);
        while( true ) {
          jDeps.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                        ::end(targets);
          bVar4 = std::operator!=(&local_98,
                                  (_Self *)&jDeps.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (!bVar4) break;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&depsIntersection.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_e8);
          pcVar9 = GetGlobalNinjaGenerator(this);
          ppcVar10 = std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator*(&local_98);
          pcVar2 = *ppcVar10;
          psVar11 = cmCustomCommandGenerator::GetOutputConfig_abi_cxx11_(this_01);
          sVar12 = std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                   ::size((vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                           *)&__range1);
          cmGlobalNinjaGenerator::AppendTargetDependsClosure
                    (pcVar9,pcVar2,
                     (cmNinjaDeps *)
                     &depsIntersection.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar11,fileConfig,
                     1 < sVar12);
          ppbVar1 = &depsIntersection.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          iVar13 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)ppbVar1);
          iVar14 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)ppbVar1);
          std::
          sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )iVar13._M_current,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )iVar14._M_current);
          iVar13 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&j);
          iVar14 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&j);
          ppbVar1 = &depsIntersection.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          __first2 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)ppbVar1);
          __last2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ppbVar1);
          __result = std::
                     back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                               ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_e8);
          std::
          set_intersection<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )iVar13._M_current,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )iVar14._M_current,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__first2._M_current,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__last2._M_current,__result);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&j,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_e8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_e8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&depsIntersection.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator++(&local_98);
        }
        pvVar8 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(this_01);
        paths = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(this_01);
        bVar4 = false;
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar8);
        output = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(pvVar8);
        while (bVar5 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&output), bVar5) {
          sf = (cmSourceFile *)
               __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
          this_02 = cmMakefile::GetSource
                              ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,
                               (string *)sf,Ambiguous);
          local_168 = this_02;
          if (this_02 != (cmSourceFile *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_188,"SYMBOLIC",
                       (allocator<char> *)
                       ((long)&ccOutputs.WorkDirOuts.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            bVar5 = cmSourceFile::GetPropertyAsBool(this_02,&local_188);
            std::__cxx11::string::~string((string *)&local_188);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&ccOutputs.WorkDirOuts.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            if (bVar5) {
              bVar4 = true;
              break;
            }
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
        cmGlobalNinjaGenerator::CCOutputs::CCOutputs
                  ((CCOutputs *)((long)&mainOutput.field_2 + 8),
                   (cmGlobalNinjaGenerator *)
                   ccgs.
                   super__Vector_base<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmGlobalNinjaGenerator::CCOutputs::Add((CCOutputs *)((long)&mainOutput.field_2 + 8),pvVar8);
        cmGlobalNinjaGenerator::CCOutputs::Add((CCOutputs *)((long)&mainOutput.field_2 + 8),paths);
        pvVar15 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&ccOutputs,0);
        std::__cxx11::string::string
                  ((string *)
                   &ninjaDeps.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar15);
        ppbVar1 = &cmdLines.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ppbVar1);
        AppendCustomCommandDeps(this,this_01,(cmNinjaDeps *)ppbVar1,fileConfig);
        pvVar8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&build.RspFile.field_2 + 8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(pvVar8);
        AppendCustomCommandLines(this,this_01,pvVar8);
        bVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&build.RspFile.field_2 + 8));
        if (bVar5) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_358,"phony",&local_359);
          cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_338,&local_358);
          std::__cxx11::string::~string((string *)&local_358);
          std::allocator<char>::~allocator(&local_359);
          cmAlphaNum::cmAlphaNum(&local_3b0,"Phony custom command for ");
          cmAlphaNum::cmAlphaNum
                    ((cmAlphaNum *)((long)&customStep.field_2 + 8),
                     (string *)
                     &ninjaDeps.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          cmStrCat<>(&local_380,&local_3b0,(cmAlphaNum *)((long)&customStep.field_2 + 8));
          std::__cxx11::string::operator=((string *)local_338,(string *)&local_380);
          std::__cxx11::string::~string((string *)&local_380);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&build.Rule.field_2 + 8),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&ccOutputs);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&build.ImplicitOuts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&ccOutputs.ExplicitOuts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&build.WorkDirOuts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&cmdLines.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&build.ImplicitDeps.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&j);
          pcVar3 = ccgs.
                   super__Vector_base<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          os = GetImplFileStream(this,fileConfig);
          cmGlobalNinjaGenerator::WriteBuild
                    ((cmGlobalNinjaGenerator *)pcVar3,(ostream *)os,(cmNinjaBuild *)local_338,0,
                     (bool *)0x0);
          cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_338);
        }
        else {
          cmsys::SystemTools::GetFilenameName
                    ((string *)&hash.CTX,
                     (string *)
                     &ninjaDeps.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          uVar6 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                    _vptr_cmGlobalGenerator[0x26])();
          if ((uVar6 & 1) != 0) {
            std::__cxx11::string::operator+=((string *)&hash.CTX,'-');
            std::__cxx11::string::operator+=((string *)&hash.CTX,(string *)fileConfig);
            std::__cxx11::string::operator+=((string *)&hash.CTX,'-');
            psVar11 = cmCustomCommandGenerator::GetOutputConfig_abi_cxx11_(this_01);
            std::__cxx11::string::operator+=((string *)&hash.CTX,(string *)psVar11);
          }
          std::__cxx11::string::operator+=((string *)&hash.CTX,'-');
          cmCryptoHash::cmCryptoHash((cmCryptoHash *)local_410,AlgoSHA256);
          input = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)
                             &ninjaDeps.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          depfile.field_2._8_8_ = input._M_len;
          cmCryptoHash::HashString_abi_cxx11_(&local_450,(cmCryptoHash *)local_410,input);
          std::__cxx11::string::substr((ulong)local_430,(ulong)&local_450);
          std::__cxx11::string::operator+=((string *)&hash.CTX,local_430);
          std::__cxx11::string::~string(local_430);
          std::__cxx11::string::~string((string *)&local_450);
          cmCustomCommandGenerator::GetDepfile_abi_cxx11_((string *)local_480,this_01);
          uVar16 = std::__cxx11::string::empty();
          if (((uVar16 & 1) == 0) && (PVar7 = cmCustomCommand::GetCMP0116Status(cc), PVar7 != OLD))
          {
            if (PVar7 == WARN) {
              local_4a2 = 0;
              local_4a3 = 0;
              psVar11 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                                  ((cmLocalGenerator *)this);
              __rhs = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
              bVar5 = std::operator!=(psVar11,__rhs);
              local_721 = true;
              if (!bVar5) {
                this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
                std::allocator<char>::allocator();
                local_4a2 = 1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4a0,"CMAKE_POLICY_WARNING_CMP0116",&local_4a1);
                local_4a3 = 1;
                local_721 = cmMakefile::PolicyOptionalWarningEnabled(this_00,&local_4a0);
              }
              if ((local_4a3 & 1) != 0) {
                std::__cxx11::string::~string((string *)&local_4a0);
              }
              if ((local_4a2 & 1) != 0) {
                std::allocator<char>::~allocator(&local_4a1);
              }
              if (local_721 != false) {
                this_03 = GetCMakeInstance(this);
                cmPolicies::GetPolicyWarning_abi_cxx11_(&local_4c8,(cmPolicies *)0x74,id);
                backtrace = cmCustomCommand::GetBacktrace(cc);
                cmake::IssueMessage(this_03,AUTHOR_WARNING,&local_4c8,backtrace);
                std::__cxx11::string::~string((string *)&local_4c8);
              }
            }
            else if (PVar7 - NEW < 3) {
              cmCustomCommandGenerator::GetInternalDepfile_abi_cxx11_
                        ((string *)((long)&comment.field_2 + 8),this_01);
              std::__cxx11::string::operator=
                        ((string *)local_480,(string *)(comment.field_2._M_local_buf + 8));
              std::__cxx11::string::~string((string *)(comment.field_2._M_local_buf + 8));
            }
          }
          cmAlphaNum::cmAlphaNum(&local_538,"Custom command for ");
          cmAlphaNum::cmAlphaNum
                    (&local_568,
                     (string *)
                     &ninjaDeps.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          cmStrCat<>((string *)local_508,&local_538,&local_568);
          pcVar3 = ccgs.
                   super__Vector_base<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          psVar11 = cmCustomCommandGenerator::GetOutputConfig_abi_cxx11_(this_01);
          BuildCommandLine(&local_588,this,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&build.RspFile.field_2 + 8),psVar11,fileConfig,
                           (string *)&hash.CTX,(cmGeneratorTarget *)0x0);
          cmLocalGenerator::ConstructComment_abi_cxx11_
                    (&local_5a8,(cmLocalGenerator *)this,this_01,"");
          psVar11 = cmCustomCommand::GetJobPool_abi_cxx11_(cc);
          bVar5 = cmCustomCommand::GetUsesTerminal(cc);
          local_76a = 1;
          if (bVar4) {
            bVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty(paths);
            local_76a = bVar4 ^ 0xff;
          }
          cmGlobalNinjaGenerator::CCOutputs::CCOutputs
                    (&local_5e0,(CCOutputs *)((long)&mainOutput.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_5f8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&cmdLines.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_610,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&j);
          cmGlobalNinjaGenerator::WriteCustomCommandBuild
                    ((cmGlobalNinjaGenerator *)pcVar3,&local_588,&local_5a8,(string *)local_508,
                     (string *)local_480,psVar11,bVar5,(bool)(local_76a & 1),fileConfig,&local_5e0,
                     &local_5f8,&local_610);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_610);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_5f8);
          cmGlobalNinjaGenerator::CCOutputs::~CCOutputs(&local_5e0);
          std::__cxx11::string::~string((string *)&local_5a8);
          std::__cxx11::string::~string((string *)&local_588);
          std::__cxx11::string::~string((string *)local_508);
          std::__cxx11::string::~string((string *)local_480);
          cmCryptoHash::~cmCryptoHash((cmCryptoHash *)local_410);
          std::__cxx11::string::~string((string *)&hash.CTX);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&build.RspFile.field_2 + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cmdLines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &ninjaDeps.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmGlobalNinjaGenerator::CCOutputs::~CCOutputs((CCOutputs *)((long)&mainOutput.field_2 + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&j);
      }
      __gnu_cxx::
      __normal_iterator<cmCustomCommandGenerator_*,_std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>_>
      ::operator++(&__end1);
    }
    std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>::~vector
              ((vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *)
               &__range1);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteCustomCommandBuildStatement(
  cmCustomCommand const* cc, const std::set<cmGeneratorTarget*>& targets,
  const std::string& fileConfig)
{
  cmGlobalNinjaGenerator* gg = this->GetGlobalNinjaGenerator();
  if (gg->SeenCustomCommand(cc, fileConfig)) {
    return;
  }

  auto ccgs = this->MakeCustomCommandGenerators(*cc, fileConfig);
  for (cmCustomCommandGenerator const& ccg : ccgs) {
    if (ccg.GetOutputs().empty() && ccg.GetByproducts().empty()) {
      // Generator expressions evaluate to no output for this config.
      continue;
    }

    cmNinjaDeps orderOnlyDeps;

    // A custom command may appear on multiple targets.  However, some build
    // systems exist where the target dependencies on some of the targets are
    // overspecified, leading to a dependency cycle.  If we assume all target
    // dependencies are a superset of the true target dependencies for this
    // custom command, we can take the set intersection of all target
    // dependencies to obtain a correct dependency list.
    //
    // FIXME: This won't work in certain obscure scenarios involving indirect
    // dependencies.
    auto j = targets.begin();
    assert(j != targets.end());
    this->GetGlobalNinjaGenerator()->AppendTargetDependsClosure(
      *j, orderOnlyDeps, ccg.GetOutputConfig(), fileConfig, ccgs.size() > 1);
    std::sort(orderOnlyDeps.begin(), orderOnlyDeps.end());
    ++j;

    for (; j != targets.end(); ++j) {
      std::vector<std::string> jDeps;
      std::vector<std::string> depsIntersection;
      this->GetGlobalNinjaGenerator()->AppendTargetDependsClosure(
        *j, jDeps, ccg.GetOutputConfig(), fileConfig, ccgs.size() > 1);
      std::sort(jDeps.begin(), jDeps.end());
      std::set_intersection(orderOnlyDeps.begin(), orderOnlyDeps.end(),
                            jDeps.begin(), jDeps.end(),
                            std::back_inserter(depsIntersection));
      orderOnlyDeps = depsIntersection;
    }

    const std::vector<std::string>& outputs = ccg.GetOutputs();
    const std::vector<std::string>& byproducts = ccg.GetByproducts();

    bool symbolic = false;
    for (std::string const& output : outputs) {
      if (cmSourceFile* sf = this->Makefile->GetSource(output)) {
        if (sf->GetPropertyAsBool("SYMBOLIC")) {
          symbolic = true;
          break;
        }
      }
    }

    cmGlobalNinjaGenerator::CCOutputs ccOutputs(gg);
    ccOutputs.Add(outputs);
    ccOutputs.Add(byproducts);

    std::string mainOutput = ccOutputs.ExplicitOuts[0];

    cmNinjaDeps ninjaDeps;
    this->AppendCustomCommandDeps(ccg, ninjaDeps, fileConfig);

    std::vector<std::string> cmdLines;
    this->AppendCustomCommandLines(ccg, cmdLines);

    if (cmdLines.empty()) {
      cmNinjaBuild build("phony");
      build.Comment = cmStrCat("Phony custom command for ", mainOutput);
      build.Outputs = std::move(ccOutputs.ExplicitOuts);
      build.WorkDirOuts = std::move(ccOutputs.WorkDirOuts);
      build.ExplicitDeps = std::move(ninjaDeps);
      build.OrderOnlyDeps = orderOnlyDeps;
      gg->WriteBuild(this->GetImplFileStream(fileConfig), build);
    } else {
      std::string customStep = cmSystemTools::GetFilenameName(mainOutput);
      if (this->GlobalGenerator->IsMultiConfig()) {
        customStep += '-';
        customStep += fileConfig;
        customStep += '-';
        customStep += ccg.GetOutputConfig();
      }
      // Hash full path to make unique.
      customStep += '-';
      cmCryptoHash hash(cmCryptoHash::AlgoSHA256);
      customStep += hash.HashString(mainOutput).substr(0, 7);

      std::string depfile = ccg.GetDepfile();
      if (!depfile.empty()) {
        switch (cc->GetCMP0116Status()) {
          case cmPolicies::WARN:
            if (this->GetCurrentBinaryDirectory() !=
                  this->GetBinaryDirectory() ||
                this->Makefile->PolicyOptionalWarningEnabled(
                  "CMAKE_POLICY_WARNING_CMP0116")) {
              this->GetCMakeInstance()->IssueMessage(
                MessageType::AUTHOR_WARNING,
                cmPolicies::GetPolicyWarning(cmPolicies::CMP0116),
                cc->GetBacktrace());
            }
            CM_FALLTHROUGH;
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            depfile = ccg.GetInternalDepfile();
            break;
        }
      }

      std::string comment = cmStrCat("Custom command for ", mainOutput);
      gg->WriteCustomCommandBuild(
        this->BuildCommandLine(cmdLines, ccg.GetOutputConfig(), fileConfig,
                               customStep),
        this->ConstructComment(ccg), comment, depfile, cc->GetJobPool(),
        cc->GetUsesTerminal(),
        /*restat*/ !symbolic || !byproducts.empty(), fileConfig,
        std::move(ccOutputs), std::move(ninjaDeps), std::move(orderOnlyDeps));
    }
  }
}